

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImRect ImGui::GetWindowAllowedExtentRect(ImGuiWindow *window)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImGuiViewportP *pIVar3;
  ImGuiContext *g;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  ImRect IVar10;
  
  pIVar3 = *(GImGui->Viewports).Data;
  IVar1 = (pIVar3->super_ImGuiViewport).Pos;
  IVar2 = (pIVar3->super_ImGuiViewport).Size;
  fVar4 = IVar1.x;
  fVar8 = IVar2.x + fVar4;
  fVar5 = IVar1.y;
  fVar9 = IVar2.y + fVar5;
  IVar1 = (GImGui->Style).DisplaySafeAreaPadding;
  fVar6 = IVar1.x;
  fVar7 = IVar1.y;
  fVar6 = (float)((uint)-fVar6 & -(uint)(fVar6 + fVar6 < fVar8 - fVar4));
  fVar7 = (float)((uint)-fVar7 & -(uint)(fVar7 + fVar7 < fVar9 - fVar5));
  IVar10.Min.x = fVar4 - fVar6;
  IVar10.Min.y = fVar5 - fVar7;
  IVar10.Max.x = fVar6 + fVar8;
  IVar10.Max.y = fVar7 + fVar9;
  return IVar10;
}

Assistant:

ImRect ImGui::GetWindowAllowedExtentRect(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_UNUSED(window);
    ImRect r_screen = ((ImGuiViewportP*)(void*)GetMainViewport())->GetMainRect();
    ImVec2 padding = g.Style.DisplaySafeAreaPadding;
    r_screen.Expand(ImVec2((r_screen.GetWidth() > padding.x * 2) ? -padding.x : 0.0f, (r_screen.GetHeight() > padding.y * 2) ? -padding.y : 0.0f));
    return r_screen;
}